

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_binsl_b_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int64_t iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  uVar3 = (ulong)wd;
  lVar4 = uVar3 * 0x10;
  lVar5 = (ulong)ws * 0x10;
  lVar2 = (ulong)wt * 0x10;
  iVar1 = msa_binsl_df(0,(long)*(char *)((env->active_fpu).fpr + uVar3),
                       (long)*(char *)((env->active_fpu).fpr + ws),
                       (long)*(char *)((env->active_fpu).fpr + wt));
  *(char *)((env->active_fpu).fpr + uVar3) = (char)iVar1;
  iVar1 = msa_binsl_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 1),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar5 + 1),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 1));
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 1) = (char)iVar1;
  iVar1 = msa_binsl_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 2),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar5 + 2),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 2));
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 2) = (char)iVar1;
  iVar1 = msa_binsl_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 3),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar5 + 3),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 3));
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 3) = (char)iVar1;
  iVar1 = msa_binsl_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 4),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar5 + 4),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 4));
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 4) = (char)iVar1;
  iVar1 = msa_binsl_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 5),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar5 + 5),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 5));
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 5) = (char)iVar1;
  iVar1 = msa_binsl_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 6),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar5 + 6),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 6));
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 6) = (char)iVar1;
  iVar1 = msa_binsl_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 7),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar5 + 7),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 7));
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 7) = (char)iVar1;
  iVar1 = msa_binsl_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 8),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar5 + 8),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 8));
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 8) = (char)iVar1;
  iVar1 = msa_binsl_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 9),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar5 + 9),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 9));
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 9) = (char)iVar1;
  iVar1 = msa_binsl_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 10),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar5 + 10),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 10));
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 10) = (char)iVar1;
  iVar1 = msa_binsl_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 0xb),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar5 + 0xb),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 0xb));
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 0xb) = (char)iVar1;
  iVar1 = msa_binsl_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 0xc),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar5 + 0xc),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 0xc));
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 0xc) = (char)iVar1;
  iVar1 = msa_binsl_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 0xd),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar5 + 0xd),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 0xd));
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 0xd) = (char)iVar1;
  iVar1 = msa_binsl_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 0xe),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar5 + 0xe),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 0xe));
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 0xe) = (char)iVar1;
  iVar1 = msa_binsl_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 0xf),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar5 + 0xf),
                       (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 0xf));
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 0xf) = (char)iVar1;
  return;
}

Assistant:

void helper_msa_binsl_b(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_binsl_df(DF_BYTE, pwd->b[0],  pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_binsl_df(DF_BYTE, pwd->b[1],  pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_binsl_df(DF_BYTE, pwd->b[2],  pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_binsl_df(DF_BYTE, pwd->b[3],  pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_binsl_df(DF_BYTE, pwd->b[4],  pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_binsl_df(DF_BYTE, pwd->b[5],  pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_binsl_df(DF_BYTE, pwd->b[6],  pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_binsl_df(DF_BYTE, pwd->b[7],  pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_binsl_df(DF_BYTE, pwd->b[8],  pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_binsl_df(DF_BYTE, pwd->b[9],  pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_binsl_df(DF_BYTE, pwd->b[10], pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_binsl_df(DF_BYTE, pwd->b[11], pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_binsl_df(DF_BYTE, pwd->b[12], pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_binsl_df(DF_BYTE, pwd->b[13], pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_binsl_df(DF_BYTE, pwd->b[14], pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_binsl_df(DF_BYTE, pwd->b[15], pws->b[15], pwt->b[15]);
}